

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int set_file_mtime_all(int argc,char **argv)

{
  int iVar1;
  ulonglong uVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  lVar3 = zip_get_num_entries(za,0);
  if (lVar3 < 0) {
    set_file_mtime_all_cold_2();
LAB_001060bb:
    iVar1 = -1;
  }
  else if (lVar3 != 0) {
    lVar4 = 0;
    do {
      iVar1 = zip_file_set_mtime(za,lVar4,uVar2,0);
      if (iVar1 < 0) {
        set_file_mtime_all_cold_1();
        goto LAB_001060bb;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
set_file_mtime_all(int argc, char *argv[]) {
    /* set last modification time (mtime) for all files */
    time_t mtime;
    zip_int64_t num_entries;
    zip_uint64_t idx;
    mtime = (time_t)strtoull(argv[0], NULL, 10);

    if ((num_entries = zip_get_num_entries(za, 0)) < 0) {
	fprintf(stderr, "can't get number of entries: %s\n", zip_strerror(za));
	return -1;
    }
    for (idx = 0; idx < (zip_uint64_t)num_entries; idx++) {
	if (zip_file_set_mtime(za, idx, mtime, 0) < 0) {
	    fprintf(stderr, "can't set file mtime at index '%" PRIu64 "' to '%lld': %s\n", idx, (long long)mtime, zip_strerror(za));
	    return -1;
	}
    }
    return 0;
}